

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container_memory.h
# Opt level: O3

void absl::lts_20250127::container_internal::
     Deallocate<8ul,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>>>
               (allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>
                *alloc,void *p,size_t n)

{
  if (n != 0) {
    operator_delete(p,n + 7 & 0xfffffffffffffff8);
    return;
  }
  __assert_fail("n && \"n must be positive\"",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/container_memory.h"
                ,0x59,
                "void absl::container_internal::Deallocate(Alloc *, void *, size_t) [Alignment = 8UL, Alloc = std::allocator<std::pair<const std::basic_string<char>, const google::protobuf::FileDescriptorProto *>>]"
               );
}

Assistant:

void Deallocate(Alloc* alloc, void* p, size_t n) {
  static_assert(Alignment > 0, "");
  assert(n && "n must be positive");
  using M = AlignedType<Alignment>;
  using A = typename absl::allocator_traits<Alloc>::template rebind_alloc<M>;
  using AT = typename absl::allocator_traits<Alloc>::template rebind_traits<M>;
  // On macOS, "mem_alloc" is a #define with one argument defined in
  // rpc/types.h, so we can't name the variable "mem_alloc" and initialize it
  // with the "foo(bar)" syntax.
  A my_mem_alloc(*alloc);
  AT::deallocate(my_mem_alloc, static_cast<M*>(p),
                 (n + sizeof(M) - 1) / sizeof(M));
}